

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_ret lzma_index_append(lzma_index *i,lzma_allocator *allocator,lzma_vli unpadded_size,
                          lzma_vli uncompressed_size)

{
  index_tree_node *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  lzma_vli lVar5;
  index_tree_node *local_68;
  lzma_vli local_60;
  uint32_t index_list_size_add;
  lzma_vli uncompressed_base;
  lzma_vli compressed_base;
  index_group *g;
  index_stream *s;
  lzma_vli uncompressed_size_local;
  lzma_vli unpadded_size_local;
  lzma_allocator *allocator_local;
  lzma_index *i_local;
  
  if ((((i == (lzma_index *)0x0) || (unpadded_size < 5)) || (0x7ffffffffffffffc < unpadded_size)) ||
     (0x7fffffffffffffff < uncompressed_size)) {
    i_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    piVar1 = (i->streams).rightmost;
    compressed_base = (lzma_vli)piVar1[1].right;
    if ((index_tree_node *)compressed_base == (index_tree_node *)0x0) {
      local_60 = 0;
      local_68 = (index_tree_node *)0x0;
    }
    else {
      local_60 = vli_ceil4((lzma_vli)
                           (&((index_tree_node *)(compressed_base + 0x28))->right)
                           [(long)((index_tree_node *)(compressed_base + 0x28))->parent * 2]);
      local_68 = (&((index_tree_node *)(compressed_base + 0x28))->left)
                 [(long)((index_tree_node *)(compressed_base + 0x28))->parent * 2];
    }
    uVar2 = lzma_vli_size(unpadded_size);
    uVar3 = lzma_vli_size(uncompressed_size);
    uVar4 = uVar2 + uVar3;
    lVar5 = index_file_size(piVar1->compressed_base,local_60 + unpadded_size,
                            piVar1[2].compressed_base + 1,
                            (long)&(piVar1[2].parent)->uncompressed_base + (ulong)uVar4,
                            piVar1[4].uncompressed_base);
    if (lVar5 == 0xffffffffffffffff) {
      i_local._4_4_ = LZMA_DATA_ERROR;
    }
    else {
      lVar5 = index_size(i->record_count + 1,i->index_list_size + (ulong)uVar4);
      if (lVar5 < 0x400000001) {
        if (((index_tree_node *)compressed_base == (index_tree_node *)0x0) ||
           ((undefined1 *)((index_tree_node *)(compressed_base + 0x28))->compressed_base <=
            (undefined1 *)
            ((long)&((index_tree_node *)(compressed_base + 0x28))->parent->uncompressed_base + 1U)))
        {
          compressed_base = (lzma_vli)lzma_alloc(i->prealloc * 0x10 + 0x40,allocator);
          if ((index_tree_node *)compressed_base == (index_tree_node *)0x0) {
            return LZMA_MEM_ERROR;
          }
          ((index_tree_node *)(compressed_base + 0x28))->parent = (index_tree_node *)0x0;
          ((index_tree_node *)(compressed_base + 0x28))->compressed_base = i->prealloc;
          i->prealloc = 0x200;
          ((index_tree_node *)compressed_base)->uncompressed_base = (lzma_vli)local_68;
          ((index_tree_node *)compressed_base)->compressed_base = local_60;
          ((index_tree_node *)(compressed_base + 0x28))->uncompressed_base =
               piVar1[2].compressed_base + 1;
          index_tree_append((index_tree *)&piVar1[1].parent,(index_tree_node *)compressed_base);
        }
        else {
          ((index_tree_node *)(compressed_base + 0x28))->parent =
               (index_tree_node *)
               ((long)&((index_tree_node *)(compressed_base + 0x28))->parent->uncompressed_base + 1)
          ;
        }
        *(lzma_vli *)(compressed_base + 0x40 + *(long *)(compressed_base + 0x38) * 0x10) =
             (long)&local_68->uncompressed_base + uncompressed_size;
        *(lzma_vli *)(compressed_base + *(long *)(compressed_base + 0x38) * 0x10 + 0x48) =
             local_60 + unpadded_size;
        piVar1[2].compressed_base = piVar1[2].compressed_base + 1;
        piVar1[2].parent =
             (index_tree_node *)((long)&(piVar1[2].parent)->uncompressed_base + (ulong)uVar4);
        lVar5 = vli_ceil4(unpadded_size);
        i->total_size = lVar5 + i->total_size;
        i->uncompressed_size = uncompressed_size + i->uncompressed_size;
        i->record_count = i->record_count + 1;
        i->index_list_size = (ulong)uVar4 + i->index_list_size;
        i_local._4_4_ = LZMA_OK;
      }
      else {
        i_local._4_4_ = LZMA_DATA_ERROR;
      }
    }
  }
  return i_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_append(lzma_index *i, const lzma_allocator *allocator,
		lzma_vli unpadded_size, lzma_vli uncompressed_size)
{
	// Validate.
	if (i == NULL || unpadded_size < UNPADDED_SIZE_MIN
			|| unpadded_size > UNPADDED_SIZE_MAX
			|| uncompressed_size > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	index_stream *s = (index_stream *)(i->streams.rightmost);
	index_group *g = (index_group *)(s->groups.rightmost);

	const lzma_vli compressed_base = g == NULL ? 0
			: vli_ceil4(g->records[g->last].unpadded_sum);
	const lzma_vli uncompressed_base = g == NULL ? 0
			: g->records[g->last].uncompressed_sum;
	const uint32_t index_list_size_add = lzma_vli_size(unpadded_size)
			+ lzma_vli_size(uncompressed_size);

	// Check that the file size will stay within limits.
	if (index_file_size(s->node.compressed_base,
			compressed_base + unpadded_size, s->record_count + 1,
			s->index_list_size + index_list_size_add,
			s->stream_padding) == LZMA_VLI_UNKNOWN)
		return LZMA_DATA_ERROR;

	// The size of the Index field must not exceed the maximum value
	// that can be stored in the Backward Size field.
	if (index_size(i->record_count + 1,
			i->index_list_size + index_list_size_add)
			> LZMA_BACKWARD_SIZE_MAX)
		return LZMA_DATA_ERROR;

	if (g != NULL && g->last + 1 < g->allocated) {
		// There is space in the last group at least for one Record.
		++g->last;
	} else {
		// We need to allocate a new group.
		g = lzma_alloc(sizeof(index_group)
				+ i->prealloc * sizeof(index_record),
				allocator);
		if (g == NULL)
			return LZMA_MEM_ERROR;

		g->last = 0;
		g->allocated = i->prealloc;

		// Reset prealloc so that if the application happens to
		// add new Records, the allocation size will be sane.
		i->prealloc = INDEX_GROUP_SIZE;

		// Set the start offsets of this group.
		g->node.uncompressed_base = uncompressed_base;
		g->node.compressed_base = compressed_base;
		g->number_base = s->record_count + 1;

		// Add the new group to the Stream.
		index_tree_append(&s->groups, &g->node);
	}

	// Add the new Record to the group.
	g->records[g->last].uncompressed_sum
			= uncompressed_base + uncompressed_size;
	g->records[g->last].unpadded_sum
			= compressed_base + unpadded_size;

	// Update the totals.
	++s->record_count;
	s->index_list_size += index_list_size_add;

	i->total_size += vli_ceil4(unpadded_size);
	i->uncompressed_size += uncompressed_size;
	++i->record_count;
	i->index_list_size += index_list_size_add;

	return LZMA_OK;
}